

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDFace * __thiscall ON_SubDEdgePtr::RelativeFace(ON_SubDEdgePtr *this,int relative_face_index)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ON_SubDFace *pOVar5;
  bool bVar6;
  ON_SubDFace *LR [2];
  
  if ((uint)relative_face_index < 2) {
    uVar2 = this->m_ptr & 0xfffffffffffffff8;
    if ((uVar2 != 0) && (uVar3 = (ulong)*(ushort *)(uVar2 + 100), uVar3 < 3)) {
      LR[1] = (ON_SubDFace *)0x0;
      if (uVar3 == 0) {
        LR[0] = (ON_SubDFace *)0x0;
      }
      else {
        LR[1] = (ON_SubDFace *)0x0;
        uVar4 = 0;
        LR[0] = (ON_SubDFace *)0x0;
        do {
          uVar1 = *(ulong *)(uVar2 + 0x68 + uVar4 * 8);
          pOVar5 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
          if (pOVar5 == (ON_SubDFace *)0x0) {
            bVar6 = false;
          }
          else if ((uVar1 & 1) == 0) {
            bVar6 = LR[0] != (ON_SubDFace *)0x0;
            if (!bVar6) {
              LR[0] = pOVar5;
            }
          }
          else {
            bVar6 = LR[1] != (ON_SubDFace *)0x0;
            if (!bVar6) {
              LR[1] = pOVar5;
            }
          }
          if (bVar6) {
            return (ON_SubDFace *)0x0;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      uVar2 = (ulong)(1 - relative_face_index);
      if ((this->m_ptr & 1) == 0) {
        uVar2 = (ulong)(uint)relative_face_index;
      }
      return LR[uVar2];
    }
  }
  return (ON_SubDFace *)0x0;
}

Assistant:

const class ON_SubDFace* ON_SubDEdgePtr::RelativeFace(
  int relative_face_index
) const
{
  if (relative_face_index < 0 || relative_face_index > 1)
    return nullptr; // invalid input
  
  const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
  if (nullptr == e )
    return nullptr; // null input

  if (nullptr == e || e->m_face_count > 2)
    return nullptr; // nonmanifold edge

  const ON_SubDFace* LR[2] = {};
  for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
  {
    const ON__UINT_PTR ptr = e->m_face2[efi].m_ptr;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(ptr);
    if (nullptr == f)
      continue;
    if (0 == ON_SUBD_FACE_DIRECTION(ptr))
    {
      if (nullptr != LR[0])
        return nullptr; // not an oriented manifold interior edge
      LR[0] = f;
    }
    else
    {
      if (nullptr != LR[1])
        return nullptr; // not an oriented manifold interior edge
      LR[1] = f;
    }
  }

  if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
    relative_face_index = 1 - relative_face_index;
  return LR[relative_face_index];
}